

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.cpp
# Opt level: O1

void booster::stack_trace::write_symbols(void **addresses,int size,ostream *out)

{
  ostream *poVar1;
  ostream *extraout_RDX;
  ostream *extraout_RDX_00;
  ulong uVar2;
  string tmp;
  char local_51;
  string local_50;
  
  if (0 < size) {
    uVar2 = 0;
    poVar1 = out;
    do {
      get_symbol_abi_cxx11_(&local_50,(stack_trace *)addresses[uVar2],poVar1);
      poVar1 = (ostream *)local_50._M_string_length;
      if ((ostream *)local_50._M_string_length != (ostream *)0x0) {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_50._M_dataplus._M_p,local_50._M_string_length);
        local_51 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_51,1);
        poVar1 = extraout_RDX;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        poVar1 = extraout_RDX_00;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)size != uVar2);
  }
  std::ostream::flush();
  return;
}

Assistant:

void write_symbols(void *const *addresses,int size,std::ostream &out)
        {
            for(int i=0;i<size;i++) {
                std::string tmp = get_symbol(addresses[i]);
                if(!tmp.empty()) {
                    out << tmp << '\n';
                }
            }
            out << std::flush;
        }